

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYWriter::PLYWriter(PLYWriter *this)

{
  undefined4 *in_RDI;
  
  std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::vector
            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)0x124ef0);
  std::ofstream::ofstream(in_RDI + 0x12);
  *in_RDI = 3;
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  return;
}

Assistant:

PLYWriter::PLYWriter()
{
  enc=ply_little_endian;
  header_complete=false;
  element=0;
  pelem=0;
  pinst=0;
  pprop=0;
  plist=0;
}